

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::SpectralFilm::AddSplat
          (SpectralFilm *this,Point2f p,SampledSpectrum L,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> t;
  Tuple2<pbrt::Point2,_float> t_00;
  initializer_list<float> __l;
  Point2<float> v;
  Point2<float> v_00;
  Vector2<float> v_01;
  Vector2<float> v_02;
  Vector2<float> v_03;
  Vector2<int> v_04;
  Point2<int> p_00;
  Vector2<float> c;
  SampledSpectrum b_00;
  SampledSpectrum a;
  bool bVar1;
  int iVar2;
  Point2i p_01;
  Pixel *pPVar3;
  Tuple2<pbrt::Point2,_int> in_RDI;
  Float i_00;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [56];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 in_ZMM2 [64];
  RGB RVar21;
  SampledSpectrum SVar22;
  int b;
  int i_1;
  int i;
  Pixel *pixel;
  Float wt;
  Point2i pi;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  Bounds2i splatBounds;
  Vector2f radius;
  Point2f pDiscrete;
  Float lm;
  Float m;
  RGB rgb;
  float in_stack_fffffffffffffdd8;
  Float in_stack_fffffffffffffddc;
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  Tuple2<pbrt::Vector2,_float> p_02;
  float in_stack_fffffffffffffde8;
  Float in_stack_fffffffffffffdec;
  Bounds2iIterator *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  Bounds2<int> *this_00;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar23;
  undefined8 in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  LogLevel in_stack_fffffffffffffe44;
  Bounds2iIterator local_178;
  Tuple2<pbrt::Point2,_int> *local_168;
  Bounds2<int> local_160;
  AtomicDouble *local_148;
  SampledWavelengths *in_stack_fffffffffffffec0;
  PixelSensor *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  Tuple2<pbrt::Point2,_int> local_f0;
  Tuple2<pbrt::Point2,_int> v_05;
  AtomicDouble *pAVar24;
  Bounds2<int> local_d0;
  undefined8 local_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  Float local_80;
  Float local_7c;
  Float local_78;
  Float local_74;
  Float *local_70;
  undefined8 local_68;
  float local_5c;
  RGB local_58;
  undefined8 local_48;
  ulong uStack_40;
  RGB local_34 [2];
  undefined8 local_18;
  ulong uStack_10;
  undefined8 local_8;
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar17 [64];
  
  iVar23 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_8 = vmovlpd_avx(in_ZMM0._0_16_);
  local_18 = vmovlpd_avx(in_ZMM1._0_16_);
  uStack_10 = vmovlpd_avx(in_ZMM2._0_16_);
  bVar1 = SampledSpectrum::HasNaNs
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  if (bVar1) {
    LogFatal<char_const(&)[13]>
              (in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,iVar23,
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (char (*) [13])CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  }
  local_48 = local_18;
  uStack_40 = uStack_10;
  auVar16 = ZEXT856(0);
  auVar20 = (undefined1  [56])0x0;
  SVar22.values.values[2] = (float)(int)in_stack_fffffffffffffed8;
  SVar22.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  SVar22.values.values[0] = (float)(int)in_stack_fffffffffffffed0;
  SVar22.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  RVar21 = PixelSensor::ToSensorRGB(in_stack_fffffffffffffec8,SVar22,in_stack_fffffffffffffec0);
  local_74 = RVar21.b;
  auVar4._0_8_ = RVar21._0_8_;
  auVar4._8_56_ = auVar16;
  local_58._0_8_ = vmovlpd_avx(auVar4._0_16_);
  local_34[0].r = local_58.r;
  local_7c = local_34[0].r;
  local_34[0].g = local_58.g;
  local_78 = local_34[0].g;
  local_70 = &local_7c;
  local_68 = 3;
  __l._M_array._4_4_ = in_stack_fffffffffffffddc;
  __l._M_array._0_4_ = in_stack_fffffffffffffdd8;
  __l._M_len._0_4_ = in_stack_fffffffffffffde0;
  __l._M_len._4_4_ = in_stack_fffffffffffffde4;
  local_58.b = local_74;
  local_34[0]._0_8_ = local_58._0_8_;
  local_34[0].b = local_74;
  local_5c = std::max<float>(__l);
  if (*(float *)((long)in_RDI + 100) < local_5c) {
    RGB::operator*=(local_34,*(float *)((long)in_RDI + 100) / local_5c);
  }
  local_80 = SampledSpectrum::MaxComponentValue
                       ((SampledSpectrum *)
                        CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (*(float *)((long)in_RDI + 100) < local_80) {
    SampledSpectrum::operator*=
              ((SampledSpectrum *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  }
  auVar16 = ZEXT856(uStack_10);
  local_b8 = local_18;
  uStack_b0 = uStack_10;
  SVar22 = SampledWavelengths::PDF
                     ((SampledWavelengths *)
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  auVar17._0_8_ = SVar22.values.values._8_8_;
  auVar17._8_56_ = auVar20;
  auVar5._0_8_ = SVar22.values.values._0_8_;
  auVar5._8_56_ = auVar16;
  local_d0.pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)vmovlpd_avx(auVar5._0_16_);
  local_c0 = vmovlpd_avx(auVar17._0_16_);
  auVar16 = ZEXT856(0);
  auVar20 = ZEXT856(0);
  a.values.values[2] = (float)(int)in_stack_fffffffffffffe00;
  a.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  a.values.values[0] = (float)(int)in_stack_fffffffffffffdf8;
  a.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  b_00.values.values[1] = in_stack_fffffffffffffdec;
  b_00.values.values[0] = in_stack_fffffffffffffde8;
  b_00.values.values._8_8_ = in_stack_fffffffffffffdf0;
  SVar22 = SafeDiv(a,b_00);
  auVar18._0_8_ = SVar22.values.values._8_8_;
  auVar18._8_56_ = auVar20;
  auVar6._0_8_ = SVar22.values.values._0_8_;
  auVar6._8_56_ = auVar16;
  local_a0 = vmovlpd_avx(auVar6._0_16_);
  local_98 = vmovlpd_avx(auVar18._0_16_);
  auVar16 = (undefined1  [56])0x0;
  SVar22 = SampledSpectrum::operator/
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                      in_stack_fffffffffffffde4);
  auVar19._0_8_ = SVar22.values.values._8_8_;
  auVar19._8_56_ = auVar20;
  auVar7._0_8_ = SVar22.values.values._0_8_;
  auVar7._8_56_ = auVar16;
  local_90 = vmovlpd_avx(auVar7._0_16_);
  uStack_88 = vmovlpd_avx(auVar19._0_16_);
  local_18 = local_90;
  uStack_10 = uStack_88;
  Vector2<float>::Vector2
            ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
  v_01.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffdec;
  v_01.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffde8;
  auVar8._0_8_ = Point2<float>::operator+
                           ((Point2<float> *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),v_01);
  auVar8._8_56_ = extraout_var;
  local_d0.pMin.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)vmovlpd_avx(auVar8._0_16_);
  auVar9._0_8_ = Filter::Radius((Filter *)
                                CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  auVar9._8_56_ = extraout_var_00;
  pAVar24 = (AtomicDouble *)vmovlpd_avx(auVar9._0_16_);
  this_00 = &local_d0;
  v_02.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffdec;
  v_02.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffde8;
  auVar10._0_8_ =
       Point2<float>::operator-
                 ((Point2<float> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  v_02);
  auVar10._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar10._0_16_);
  t.y = in_stack_fffffffffffffddc;
  t.x = in_stack_fffffffffffffdd8;
  auVar11._0_8_ = Floor<pbrt::Point2,float>(t);
  auVar11._8_56_ = extraout_var_02;
  vmovlpd_avx(auVar11._0_16_);
  v.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffde4;
  v.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffde0;
  local_148 = pAVar24;
  Point2<int>::Point2<float>
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),v);
  v_03.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffdec;
  v_03.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffde8;
  pAVar24 = local_148;
  auVar12._0_8_ =
       Point2<float>::operator+
                 ((Point2<float> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  v_03);
  auVar12._8_56_ = extraout_var_03;
  vmovlpd_avx(auVar12._0_16_);
  t_00.y = in_stack_fffffffffffffddc;
  t_00.x = in_stack_fffffffffffffdd8;
  auVar13._0_8_ = Floor<pbrt::Point2,float>(t_00);
  auVar13._8_56_ = extraout_var_04;
  vmovlpd_avx(auVar13._0_16_);
  v_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffde4;
  v_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffde0;
  Point2<int>::Point2<float>
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),v_00);
  Vector2<int>::Vector2
            ((Vector2<int> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (int)in_stack_fffffffffffffddc,(int)in_stack_fffffffffffffdd8);
  v_04.super_Tuple2<pbrt::Vector2,_int>.y = (int)in_stack_fffffffffffffdec;
  v_04.super_Tuple2<pbrt::Vector2,_int>.x = (int)in_stack_fffffffffffffde8;
  Point2<int>::operator+
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),v_04);
  Bounds2<int>::Bounds2(this_00,(Point2<int>)in_stack_fffffffffffffe10,(Point2<int>)in_RDI);
  local_160 = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffe10,(Bounds2<int> *)in_RDI);
  local_f0 = local_160.pMin.super_Tuple2<pbrt::Point2,_int>;
  local_168 = &local_f0;
  v_05 = local_160.pMax.super_Tuple2<pbrt::Point2,_int>;
  local_178 = pbrt::begin((Bounds2i *)0x8888df);
  pbrt::end((Bounds2i *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  p_02.y = in_stack_fffffffffffffde4;
  p_02.x = in_stack_fffffffffffffde0;
  while (bVar1 = Bounds2iIterator::operator!=
                           (in_stack_fffffffffffffdf0,
                            (Bounds2iIterator *)
                            CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)), bVar1) {
    p_01 = Bounds2iIterator::operator*(&local_178);
    p_00.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffdec;
    p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffffde8;
    auVar14._0_8_ = Point2<float>::operator-(p_02,p_00);
    auVar14._8_56_ = extraout_var_05;
    vmovlpd_avx(auVar14._0_16_);
    Vector2<float>::Vector2
              ((Vector2<float> *)p_02,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
    c.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffdec;
    c.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffde8;
    auVar15._0_8_ = Tuple2<pbrt::Vector2,float>::operator-(p_02,c);
    auVar15._8_56_ = extraout_var_06;
    vmovlpd_avx(auVar15._0_16_);
    Point2<float>::Point2<float>
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               (Vector2<float>)p_02);
    i_00 = Filter::Evaluate((Filter *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                            (Point2f)p_02);
    if ((i_00 != 0.0) || (NAN(i_00))) {
      pPVar3 = Array2D<pbrt::SpectralFilm::Pixel>::operator[]
                         ((Array2D<pbrt::SpectralFilm::Pixel> *)((long)in_RDI + 0x70),p_01);
      for (iVar23 = 0; iVar23 < 3; iVar23 = iVar23 + 1) {
        in_stack_fffffffffffffdf0 = (Bounds2iIterator *)(pPVar3->rgbSplat + iVar23);
        in_stack_fffffffffffffdec = i_00;
        RGB::operator[](local_34,iVar23);
        AtomicDouble::Add(pAVar24,(double)v_05);
      }
      for (iVar23 = 0; iVar23 < 4; iVar23 = iVar23 + 1) {
        SampledWavelengths::operator[]((SampledWavelengths *)p_02,(int)in_stack_fffffffffffffddc);
        iVar2 = LambdaToBucket((SpectralFilm *)p_02,in_stack_fffffffffffffddc);
        p_02 = (Tuple2<pbrt::Vector2,_float>)(pPVar3->bucketSplats + iVar2);
        in_stack_fffffffffffffddc = i_00;
        SampledSpectrum::operator[]((SampledSpectrum *)p_02,(int)i_00);
        AtomicDouble::Add(pAVar24,(double)v_05);
      }
    }
    Bounds2iIterator::operator++
              ((Bounds2iIterator *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  }
  return;
}

Assistant:

PBRT_CPU_GPU void SpectralFilm::AddSplat(Point2f p, SampledSpectrum L,
                            const SampledWavelengths &lambda) {
    // This, too, is similar to RGBFilm::AddSplat(), with additions for
    // spectra.

    CHECK(!L.HasNaNs());

    // Convert sample radiance to _PixelSensor_ RGB
    RGB rgb = sensor->ToSensorRGB(L, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue)
        rgb *= maxComponentValue / m;

    // Spectral clamping and normalization.
    Float lm = L.MaxComponentValue();
    if (lm > maxComponentValue)
        L *= maxComponentValue / lm;
    L = SafeDiv(L, lambda.PDF()) / NSpectrumSamples;

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    // Splat both RGB and spectral bucket contributions.
    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];

            for (int i = 0; i < 3; ++i)
                pixel.rgbSplat[i].Add(wt * rgb[i]);

            for (int i = 0; i < NSpectrumSamples; ++i) {
                int b = LambdaToBucket(lambda[i]);
                pixel.bucketSplats[b].Add(wt * L[i]);
            }
        }
    }
}